

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynVariableDefinition * ParseVariableDefinition(ParseContext *ctx)

{
  char *begin;
  bool bVar1;
  uint uVar2;
  SynIdentifier *this;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  SynBase *local_50;
  SynBase *initializer;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  Lexeme *start;
  ParseContext *ctx_local;
  
  name.end = (char *)ctx->currentLexeme;
  bVar1 = ParseContext::At(ctx,lex_string);
  if (bVar1) {
    _nameIdentifier = ParseContext::Consume(ctx);
    this = ParseContext::get<SynIdentifier>(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    pLVar4 = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(this,pLVar3,pLVar4,_nameIdentifier);
    uVar2 = InplaceStr::length((InplaceStr *)&nameIdentifier);
    if (0x7ff < uVar2) {
      pLVar3 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Stop
                (ctx,pLVar3,"ERROR: variable name length is limited to %d symbols",0x800);
    }
    local_50 = (SynBase *)0x0;
    bVar1 = ParseContext::Consume(ctx,lex_set);
    if ((bVar1) && (local_50 = ParseAssignment(ctx), local_50 == (SynBase *)0x0)) {
      pLVar3 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar3,"ERROR: expression not found after \'=\'");
      local_50 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar3 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_50,pLVar3,pLVar4);
    }
    ctx_local = (ParseContext *)ParseContext::get<SynVariableDefinition>(ctx);
    begin = name.end;
    pLVar3 = ParseContext::Previous(ctx);
    SynVariableDefinition::SynVariableDefinition
              ((SynVariableDefinition *)ctx_local,(Lexeme *)begin,pLVar3,this,local_50);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynVariableDefinition *)ctx_local;
}

Assistant:

SynVariableDefinition* ParseVariableDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(name.length() >= NULLC_MAX_VARIABLE_NAME_LENGTH)
			Stop(ctx, ctx.Current(), "ERROR: variable name length is limited to %d symbols", NULLC_MAX_VARIABLE_NAME_LENGTH);

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseAssignment(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynVariableDefinition>()) SynVariableDefinition(start, ctx.Previous(), nameIdentifier, initializer);
	}

	return NULL;
}